

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall cmCTestSVN::LogParser::EndElement(LogParser *this,string *name)

{
  int iVar1;
  pointer pcVar2;
  char *pcVar3;
  string *psVar4;
  string new_path;
  string orig_path;
  string local_58;
  string local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    DoRevisionSVN(this->SVN,&this->Rev,&this->Changes);
  }
  else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
      SVNInfo::BuildLocalPath(&local_58,this->SVNRepo,&local_38);
      std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        psVar4 = &(this->Rev).super_Revision.Author;
        pcVar3 = (char *)(this->Rev).super_Revision.Author._M_string_length;
      }
      else {
        if (pcVar2 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_005a5903;
        iVar1 = std::__cxx11::string::compare((char *)name);
        pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar1 == 0) {
          psVar4 = &(this->Rev).super_Revision.Date;
          pcVar3 = (char *)(this->Rev).super_Revision.Date._M_string_length;
        }
        else {
          if (pcVar2 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_005a5903;
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 != 0) goto LAB_005a5903;
          psVar4 = &(this->Rev).super_Revision.Log;
          pcVar3 = (char *)(this->Rev).super_Revision.Log._M_string_length;
          pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
      }
      std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar2);
    }
  }
LAB_005a5903:
  pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "logentry") {
      this->SVN->DoRevisionSVN(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "path") {
      std::string orig_path(this->CData.data(), this->CData.size());
      std::string new_path = this->SVNRepo.BuildLocalPath(orig_path);
      this->CurChange.Path.assign(new_path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(this->CData.data(), this->CData.size());
    }
    this->CData.clear();
  }